

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O1

bool TestCompressionF<Counter<unsigned_long,64u>,Counter<unsigned_char,8u>>(int bias)

{
  ulong uVar1;
  ulong uVar2;
  Counter<unsigned_long,_64U> fullOriginal;
  ulong uVar3;
  int iVar4;
  unsigned_long absDiff;
  long lVar5;
  uint recent;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  lVar5 = 0;
  uVar3 = 0;
  bVar10 = false;
  do {
    uVar8 = uVar3 & 0xff;
    uVar6 = 0;
    uVar9 = uVar3;
    do {
      if (uVar6 < uVar3) {
        iVar4 = 7;
        if ((long)uVar9 < (long)(0x80 - bias)) {
LAB_00102c55:
          uVar7 = (uint)uVar6 & 0x100 | uVar8;
          uVar1 = uVar6 & 0xff;
          if (uVar1 < uVar8) {
            uVar2 = uVar7 - 0x100;
            if (uVar8 - uVar1 < 0x80U - (long)bias) {
              uVar2 = uVar7;
            }
          }
          else {
            uVar2 = uVar7 + 0x100;
            if (uVar1 - uVar8 <= (long)bias + 0x80U) {
              uVar2 = uVar7;
            }
          }
          iVar4 = 1;
          if ((uVar2 == uVar3) && ((bias != 0 || (uVar3 - (long)(char)uVar9 == uVar6)))) {
            iVar4 = 0;
          }
        }
      }
      else {
        if ((long)(lVar5 + uVar6) <= (long)(bias + 0x80)) goto LAB_00102c55;
        iVar4 = 7;
      }
      if ((iVar4 != 7) && (iVar4 != 0)) goto LAB_00102cd2;
      uVar6 = uVar6 + 1;
      uVar9 = uVar9 - 1;
    } while (uVar6 != 0x200);
    iVar4 = 5;
LAB_00102cd2:
    if ((iVar4 != 5) && (iVar4 != 0)) {
      return bVar10;
    }
    bVar10 = 0x1fe < uVar3;
    uVar3 = uVar3 + 1;
    lVar5 = lVar5 + -1;
    if (uVar3 == 0x200) {
      return bVar10;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}